

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_window.c
# Opt level: O0

void applySizeLimits(_GLFWwindow *window,int *width,int *height)

{
  int iVar1;
  float ratio;
  int *height_local;
  int *width_local;
  _GLFWwindow *window_local;
  
  if ((window->numer != -1) && (window->denom != -1)) {
    *height = (int)((float)*width / ((float)window->numer / (float)window->denom));
  }
  if (window->minwidth == -1) {
    if (window->maxwidth != -1) {
      iVar1 = _glfw_min(*width,window->maxwidth);
      *width = iVar1;
    }
  }
  else {
    iVar1 = _glfw_max(*width,window->minwidth);
    *width = iVar1;
  }
  if (window->minheight == -1) {
    if (window->maxheight != -1) {
      iVar1 = _glfw_max(*height,window->maxheight);
      *height = iVar1;
    }
  }
  else {
    iVar1 = _glfw_min(*height,window->minheight);
    *height = iVar1;
  }
  return;
}

Assistant:

static void applySizeLimits(_GLFWwindow* window, int* width, int* height)
{
    if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
    {
        const float ratio = (float) window->numer / (float) window->denom;
        *height = (int) (*width / ratio);
    }

    if (window->minwidth != GLFW_DONT_CARE)
        *width = _glfw_max(*width, window->minwidth);
    else if (window->maxwidth != GLFW_DONT_CARE)
        *width = _glfw_min(*width, window->maxwidth);

    if (window->minheight != GLFW_DONT_CARE)
        *height = _glfw_min(*height, window->minheight);
    else if (window->maxheight != GLFW_DONT_CARE)
        *height = _glfw_max(*height, window->maxheight);
}